

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  bool bVar1;
  bool bVar2;
  FilePath parent;
  String SStack_38;
  String local_28;
  
  bVar1 = IsDirectory(this);
  if (bVar1) {
    bVar1 = true;
    if ((this->pathname_).length_ != 0) {
      bVar2 = DirectoryExists(this);
      if (!bVar2) {
        RemoveTrailingPathSeparator((FilePath *)&local_28);
        RemoveFileName((FilePath *)&SStack_38);
        String::~String(&local_28);
        bVar1 = CreateDirectoriesRecursively((FilePath *)&SStack_38);
        if (bVar1) {
          bVar1 = CreateFolder(this);
        }
        else {
          bVar1 = false;
        }
        String::~String(&SStack_38);
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}